

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTransaction::RemovePeginWitnessStackAll
          (ConfidentialTransaction *this,uint32_t tx_in_index)

{
  void *pvVar1;
  wally_tx_witness_stack *stack;
  ulong uVar2;
  CfdException *this_00;
  undefined4 in_register_00000034;
  allocator local_55;
  int ret;
  undefined1 local_50 [32];
  
  uVar2 = (ulong)tx_in_index;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,CONCAT44(in_register_00000034,tx_in_index),0x717,"RemovePeginWitnessStackAll");
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if (uVar2 < *(ulong *)((long)pvVar1 + 0x10)) {
    stack = *(wally_tx_witness_stack **)(*(long *)((long)pvVar1 + 8) + 200 + uVar2 * 0xd0);
    if (stack != (wally_tx_witness_stack *)0x0) {
      ret = wally_tx_witness_stack_free(stack);
      *(undefined8 *)(*(long *)((long)pvVar1 + 8) + 200 + uVar2 * 0xd0) = 0;
      if (ret != 0) {
        local_50._0_8_ = "cfdcore_elements_transaction.cpp";
        local_50._8_4_ = 0x722;
        local_50._16_8_ = "RemovePeginWitnessStackAll";
        logger::warn<int&>((CfdSourceLocation *)local_50,"wally_tx_witness_stack_free NG[{}].",&ret)
        ;
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string((string *)local_50,"pegin witness stack error.",&local_55);
        CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_50);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  SetElementsTxState(this);
  ConfidentialTxIn::RemovePeginWitnessStackAll
            ((this->vin_).
             super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar2);
  return;
}

Assistant:

void ConfidentialTransaction::RemovePeginWitnessStackAll(
    uint32_t tx_in_index) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    if (tx_pointer->inputs[tx_in_index].pegin_witness != NULL) {
      struct wally_tx_witness_stack *stack_pointer;
      stack_pointer = tx_pointer->inputs[tx_in_index].pegin_witness;
      int ret = wally_tx_witness_stack_free(stack_pointer);
      tx_pointer->inputs[tx_in_index].pegin_witness = NULL;
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_tx_witness_stack_free NG[{}].", ret);
        throw CfdException(
            kCfdIllegalStateError, "pegin witness stack error.");
      }
    }
  }
  SetElementsTxState();

  vin_[tx_in_index].RemovePeginWitnessStackAll();
}